

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::traverseAnnotationDecl
          (TraverseSchema *this,DOMElement *annotationElem,
          ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList,bool topLevel)

{
  XMLBuffer *this_00;
  GeneralAttributeCheck *this_01;
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  XMLSize_t XVar4;
  _func_int **pp_Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  DOMNode *node;
  undefined4 extraout_var;
  long *plVar10;
  undefined4 extraout_var_01;
  XMLCh *pXVar11;
  DOMNode **ppDVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLSize_t XVar13;
  XSAnnotation *this_02;
  undefined4 extraout_var_07;
  short *psVar14;
  XMLCh *pXVar15;
  short *psVar16;
  XMLSize_t XVar17;
  XMLSize_t XVar18;
  TraverseSchema *this_03;
  XMLSize_t i;
  XMLSize_t getAt;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  short *psVar9;
  undefined4 extraout_var_00;
  
  pSVar3 = this->fSchemaInfo;
  if (annotationElem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,annotationElem);
  }
  this_01 = &this->fAttributeCheck;
  local_40.fSchemaInfo = pSVar3;
  GeneralAttributeCheck::checkAttributes
            (this_01,annotationElem,1,this,topLevel,(ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
  node = &XUtil::getFirstChildElement(&annotationElem->super_DOMNode)->super_DOMNode;
  if (node == (DOMNode *)0x0) {
    iVar6 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[7])(annotationElem);
    plVar10 = (long *)CONCAT44(extraout_var_07,iVar6);
    if ((plVar10 != (long *)0x0) && (iVar6 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar6 == 3)) {
      pXVar11 = (XMLCh *)(**(code **)(*plVar10 + 0x140))(plVar10);
      goto LAB_0031dd50;
    }
  }
  else {
    pXVar11 = (XMLCh *)0x0;
    for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
      iVar6 = (*node->_vptr_DOMNode[0x18])(node);
      psVar9 = (short *)CONCAT44(extraout_var,iVar6);
      if (psVar9 == &SchemaSymbols::fgELT_APPINFO) {
LAB_0031dc8b:
        iVar6 = (*node->_vptr_DOMNode[7])(node);
        plVar10 = (long *)CONCAT44(extraout_var_00,iVar6);
        if ((plVar10 != (long *)0x0) &&
           (iVar6 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar6 == 3)) {
          pXVar11 = (XMLCh *)(**(code **)(*plVar10 + 0x140))(plVar10);
        }
        GeneralAttributeCheck::checkAttributes
                  (this_01,(DOMElement *)node,4,this,false,
                   (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
      }
      else {
        psVar14 = &SchemaSymbols::fgELT_APPINFO;
        if (psVar9 == (short *)0x0) {
LAB_0031dc4b:
          if (*psVar14 == 0) goto LAB_0031dc8b;
        }
        else {
          psVar14 = &SchemaSymbols::fgELT_APPINFO;
          psVar16 = psVar9;
          do {
            sVar1 = *psVar16;
            if (sVar1 == 0) goto LAB_0031dc4b;
            psVar16 = psVar16 + 1;
            sVar2 = *psVar14;
            psVar14 = psVar14 + 1;
          } while (sVar1 == sVar2);
        }
        if (psVar9 == &SchemaSymbols::fgELT_DOCUMENTATION) {
LAB_0031dcf4:
          iVar6 = (*node->_vptr_DOMNode[7])(node);
          plVar10 = (long *)CONCAT44(extraout_var_01,iVar6);
          if ((plVar10 != (long *)0x0) &&
             (iVar6 = (**(code **)(*plVar10 + 0x20))(plVar10), iVar6 == 3)) {
            pXVar11 = (XMLCh *)(**(code **)(*plVar10 + 0x140))(plVar10);
          }
          GeneralAttributeCheck::checkAttributes
                    (this_01,(DOMElement *)node,0xe,this,false,
                     (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
        }
        else {
          psVar14 = &SchemaSymbols::fgELT_DOCUMENTATION;
          if (psVar9 == (short *)0x0) {
LAB_0031dcd5:
            if (*psVar14 == 0) goto LAB_0031dcf4;
          }
          else {
            psVar14 = &SchemaSymbols::fgELT_DOCUMENTATION;
            do {
              sVar1 = *psVar9;
              if (sVar1 == 0) goto LAB_0031dcd5;
              psVar9 = psVar9 + 1;
              sVar2 = *psVar14;
              psVar14 = psVar14 + 1;
            } while (sVar1 == sVar2);
          }
          reportSchemaError(this,(DOMElement *)node,L"http://apache.org/xml/messages/XMLErrors",0x90
                           );
        }
      }
    }
LAB_0031dd50:
    if ((pXVar11 != (XMLCh *)0x0) && (this->fScanner->fIgnoreAnnotations == false)) {
      XVar4 = nonXSAttList->fCurCount;
      if (XVar4 == 0) {
        this_02 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        XSAnnotation::XSAnnotation(this_02,pXVar11,this->fGrammarPoolMemoryManager);
      }
      else {
        iVar6 = XMLString::patternMatch(pXVar11,L"annotation");
        if (iVar6 == -1) goto LAB_0031dfca;
        this_00 = &this->fBuffer;
        (this->fBuffer).fIndex = 0;
        XMLBuffer::append(this_00,pXVar11,(long)(iVar6 + 10));
        getAt = 0;
        do {
          ppDVar12 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,getAt);
          this_03 = (TraverseSchema *)*ppDVar12;
          iVar7 = (*(*(_func_int ***)this_03)[0x16])(this_03);
          iVar8 = (*(*(_func_int ***)this_03)[0x18])(this_03);
          iVar7 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[0x30])
                            (annotationElem,CONCAT44(extraout_var_02,iVar7),
                             CONCAT44(extraout_var_03,iVar8));
          psVar9 = (short *)CONCAT44(extraout_var_04,iVar7);
          if (psVar9 == &XMLUni::fgZeroLenString) {
LAB_0031de48:
            XVar13 = (this->fBuffer).fIndex;
            if (XVar13 == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar13 = this_00->fIndex;
            }
            (this->fBuffer).fIndex = XVar13 + 1;
            (this->fBuffer).fBuffer[XVar13] = L' ';
            iVar7 = (*(*(_func_int ***)this_03)[2])(this_03);
            XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var_05,iVar7));
            XVar13 = (this->fBuffer).fIndex;
            XVar18 = (this->fBuffer).fCapacity;
            if (XVar13 == XVar18) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar13 = (this->fBuffer).fIndex;
              XVar18 = (this->fBuffer).fCapacity;
            }
            pXVar15 = (this->fBuffer).fBuffer;
            XVar17 = XVar13 + 1;
            (this->fBuffer).fIndex = XVar17;
            pXVar15[XVar13] = L'=';
            if (XVar17 == XVar18) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar17 = (this->fBuffer).fIndex;
              pXVar15 = (this->fBuffer).fBuffer;
            }
            this_00->fIndex = XVar17 + 1;
            pXVar15[XVar17] = L'\"';
            iVar7 = (*(*(_func_int ***)this_03)[3])();
            processAttValue(this_03,(XMLCh *)CONCAT44(extraout_var_06,iVar7),this_00);
            XVar13 = (this->fBuffer).fIndex;
            if (XVar13 == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar13 = this_00->fIndex;
            }
            (this->fBuffer).fIndex = XVar13 + 1;
            (this->fBuffer).fBuffer[XVar13] = L'\"';
          }
          else {
            psVar14 = &XMLUni::fgZeroLenString;
            if (psVar9 == (short *)0x0) {
LAB_0031de3e:
              if (*psVar14 == 0) goto LAB_0031de48;
            }
            else {
              psVar14 = &XMLUni::fgZeroLenString;
              do {
                sVar1 = *psVar9;
                if (sVar1 == 0) goto LAB_0031de3e;
                psVar9 = psVar9 + 1;
                sVar2 = *psVar14;
                psVar14 = psVar14 + 1;
              } while (sVar1 == sVar2);
            }
          }
          getAt = getAt + 1;
        } while (getAt != XVar4);
        XMLBuffer::append(this_00,pXVar11 + (long)iVar6 + 10);
        this_02 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        pXVar11 = (this->fBuffer).fBuffer;
        pXVar11[(this->fBuffer).fIndex] = L'\0';
        XSAnnotation::XSAnnotation(this_02,pXVar11,this->fGrammarPoolMemoryManager);
      }
      pp_Var5 = annotationElem[0x17].super_DOMNode._vptr_DOMNode;
      this_02->fLine = (XMLFileLoc)annotationElem[0x16].super_DOMNode._vptr_DOMNode;
      this_02->fCol = (XMLFileLoc)pp_Var5;
      XSAnnotation::setSystemId(this_02,this->fSchemaInfo->fCurrentSchemaURL);
      goto LAB_0031dfcd;
    }
  }
LAB_0031dfca:
  this_02 = (XSAnnotation *)0x0;
LAB_0031dfcd:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return this_02;
}

Assistant:

XSAnnotation*
TraverseSchema::traverseAnnotationDecl(const DOMElement* const annotationElem,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList,
                                       const bool topLevel) {

    NamespaceScopeManager nsMgr(annotationElem, fSchemaInfo, this);
    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        annotationElem, GeneralAttributeCheck::E_Annotation, this, topLevel
    );

    const XMLCh* contents = 0;
    DOMElement* child = XUtil::getFirstChildElement(annotationElem);
    if (child) {
        for (;
             child != 0;
             child = XUtil::getNextSiblingElement(child)) {

            const XMLCh* name = child->getLocalName();

            if (XMLString::equals(name, SchemaSymbols::fgELT_APPINFO)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Appinfo, this);
            }
            else if (XMLString::equals(name, SchemaSymbols::fgELT_DOCUMENTATION)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Documentation, this);
            }
            else {
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAnnotationContent);
            }
        }
    }
    else
    {
        // If the Annotation has no children, get the text directly
        DOMNode* textContent = annotationElem->getFirstChild();
        if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
            contents = ((DOMText*) textContent)->getData();
    }

    if (contents && !fScanner->getIgnoreAnnotations())
    {
        XSAnnotation* theAnnotation = 0;

        XMLSize_t nonXSAttSize = nonXSAttList->size();

        if (nonXSAttSize)
        {
            int annotTokenStart = XMLString::patternMatch(
                contents, SchemaSymbols::fgELT_ANNOTATION);

            if (annotTokenStart == -1) // something is wrong
                return 0;

            // set annotation element
            fBuffer.set(contents, annotTokenStart + 10);

            for (XMLSize_t i=0; i<nonXSAttSize; i++)
            {
                DOMNode* attNode = nonXSAttList->elementAt(i);

                if (!XMLString::equals(
                        annotationElem->getAttributeNS(
                           attNode->getNamespaceURI(), attNode->getLocalName())
                        , XMLUni::fgZeroLenString)
                   )
                {
                    continue;
                }

                fBuffer.append(chSpace);
                fBuffer.append(attNode->getNodeName());
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attNode->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
            }

            // add remaining annotation content
            fBuffer.append(contents + annotTokenStart + 10);

            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
        }
        else
        {
            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(contents, fGrammarPoolMemoryManager);
        }

        /***
         * set line, col and systemId info
        ***/
        theAnnotation->setLineCol(
                                  ((XSDElementNSImpl*)annotationElem)->getLineNo()
                                , ((XSDElementNSImpl*)annotationElem)->getColumnNo()
                                 );
        theAnnotation->setSystemId(fSchemaInfo->getCurrentSchemaURL());

        return theAnnotation;
    }

    return 0;
}